

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int ShouldCompress(uint8_t *data,size_t mask,uint64_t last_flush_pos,size_t bytes,
                  size_t num_literals,size_t num_commands)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar14 [16];
  ulong local_4e8;
  size_t i;
  uint32_t pos;
  size_t t;
  double bit_cost_threshold;
  uint32_t literal_histo [256];
  size_t num_commands_local;
  size_t num_literals_local;
  size_t bytes_local;
  uint64_t last_flush_pos_local;
  size_t mask_local;
  uint8_t *data_local;
  uint32_t *local_90;
  double retval;
  size_t sum;
  double *local_78;
  ulong local_70;
  size_t p;
  uint32_t *population_end;
  double retval_1;
  size_t sum_1;
  undefined8 local_48;
  double *local_40;
  ulong local_38;
  double local_30;
  ulong local_28;
  double local_20;
  double local_18;
  double local_10;
  undefined4 uVar12;
  undefined4 uVar13;
  
  if (num_commands < (bytes >> 8) + 2) {
    auVar2._8_4_ = (int)(num_literals >> 0x20);
    auVar2._0_8_ = num_literals;
    auVar2._12_4_ = 0x45300000;
    uVar13 = (undefined4)(bytes >> 0x20);
    auVar14._8_4_ = uVar13;
    auVar14._0_8_ = bytes;
    auVar14._12_4_ = 0x45300000;
    if (((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0)) * 0.99 <
        (auVar2._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0)) {
      literal_histo._1016_8_ = num_commands;
      memset(&bit_cost_threshold,0,0x400);
      auVar3._8_4_ = uVar13;
      auVar3._0_8_ = bytes;
      auVar3._12_4_ = 0x45300000;
      i._4_4_ = (uint)last_flush_pos;
      for (local_4e8 = 0; local_4e8 < (bytes + 0xc) / 0xd; local_4e8 = local_4e8 + 1) {
        literal_histo[(ulong)data[i._4_4_ & mask] - 2] =
             literal_histo[(ulong)data[i._4_4_ & mask] - 2] + 1;
        i._4_4_ = i._4_4_ + 0xd;
      }
      local_78 = &bit_cost_threshold;
      sum = 0x100;
      local_48 = 0x100;
      sum_1 = (size_t)&retval;
      retval_1 = 0.0;
      population_end = (uint32_t *)0x0;
      p = (size_t)(literal_histo + 0xfe);
      local_40 = local_78;
      while (local_40 < p) {
        uVar1 = *(uint *)local_40;
        local_70 = CONCAT44(0,uVar1);
        retval_1 = (double)((long)retval_1 + local_70);
        auVar4._8_4_ = 0;
        auVar4._0_8_ = local_70;
        auVar4._12_4_ = 0x45300000;
        local_28 = local_70;
        if (local_70 < 0x100) {
          local_20 = (double)kLog2Table[local_70];
          local_40 = (double *)((long)local_40 + 4);
        }
        else {
          auVar5._8_4_ = 0;
          auVar5._0_8_ = local_70;
          auVar5._12_4_ = 0x45300000;
          local_40 = (double *)((long)local_40 + 4);
          local_20 = log2((auVar5._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (-((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_20 +
             (double)population_end);
        uVar1 = *(uint *)local_40;
        local_70 = CONCAT44(0,uVar1);
        retval_1 = (double)((long)retval_1 + local_70);
        auVar6._8_4_ = 0;
        auVar6._0_8_ = local_70;
        auVar6._12_4_ = 0x45300000;
        local_38 = local_70;
        if (local_70 < 0x100) {
          local_30 = (double)kLog2Table[local_70];
          local_40 = (double *)((long)local_40 + 4);
        }
        else {
          auVar7._8_4_ = 0;
          auVar7._0_8_ = local_70;
          auVar7._12_4_ = 0x45300000;
          local_40 = (double *)((long)local_40 + 4);
          local_30 = log2((auVar7._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (-((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_30 +
             (double)population_end);
      }
      if (retval_1 != 0.0) {
        uVar12 = (undefined4)((ulong)retval_1 >> 0x20);
        auVar8._8_4_ = uVar12;
        auVar8._0_8_ = retval_1;
        auVar8._12_4_ = 0x45300000;
        uVar13 = SUB84(retval_1,0);
        local_18 = retval_1;
        if ((ulong)retval_1 < 0x100) {
          local_10 = (double)kLog2Table[(long)retval_1];
        }
        else {
          auVar9._8_4_ = uVar12;
          auVar9._0_8_ = retval_1;
          auVar9._12_4_ = 0x45300000;
          local_10 = log2((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) * local_10 +
             (double)population_end);
      }
      *(double *)sum_1 = retval_1;
      local_90 = population_end;
      uVar13 = (undefined4)((ulong)retval >> 0x20);
      auVar10._8_4_ = uVar13;
      auVar10._0_8_ = retval;
      auVar10._12_4_ = 0x45300000;
      if ((double)population_end <
          (auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0)) {
        auVar11._8_4_ = uVar13;
        auVar11._0_8_ = retval;
        auVar11._12_4_ = 0x45300000;
        local_90 = (uint32_t *)
                   ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0));
      }
      if ((((auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0)) * 7.92) / 13.0 <
          (double)local_90) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static BROTLI_BOOL ShouldCompress(
    const uint8_t* data, const size_t mask, const uint64_t last_flush_pos,
    const size_t bytes, const size_t num_literals, const size_t num_commands) {
  if (num_commands < (bytes >> 8) + 2) {
    if (num_literals > 0.99 * (double)bytes) {
      uint32_t literal_histo[256] = { 0 };
      static const uint32_t kSampleRate = 13;
      static const double kMinEntropy = 7.92;
      const double bit_cost_threshold =
          (double)bytes * kMinEntropy / kSampleRate;
      size_t t = (bytes + kSampleRate - 1) / kSampleRate;
      uint32_t pos = (uint32_t)last_flush_pos;
      size_t i;
      for (i = 0; i < t; i++) {
        ++literal_histo[data[pos & mask]];
        pos += kSampleRate;
      }
      if (BitsEntropy(literal_histo, 256) > bit_cost_threshold) {
        return BROTLI_FALSE;
      }
    }
  }
  return BROTLI_TRUE;
}